

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall despot::Parser::~Parser(Parser *this)

{
  pointer ppCVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector(&this->is_identity_);
  std::
  deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~deque(&(this->selfloop_state_queue_).c);
  std::
  _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::_Identity<std::vector<int,_std::allocator<int>_>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~_Rb_tree(&(this->selfloop_state_set_)._M_t);
  ppCVar1 = (this->noisy_transition_funcs_).
            super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppCVar1 != (pointer)0x0) {
    operator_delete(ppCVar1,(long)(this->noisy_transition_funcs_).
                                  super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar1)
    ;
  }
  std::vector<despot::Function,_std::allocator<despot::Function>_>::~vector
            (&this->terminal_reward_funcs_);
  std::vector<despot::Function,_std::allocator<despot::Function>_>::~vector(&this->reward_funcs_);
  ppCVar1 = (this->obs_funcs_).super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppCVar1 != (pointer)0x0) {
    operator_delete(ppCVar1,(long)(this->obs_funcs_).
                                  super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar1)
    ;
  }
  ppCVar1 = (this->transition_funcs_).
            super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppCVar1 != (pointer)0x0) {
    operator_delete(ppCVar1,(long)(this->transition_funcs_).
                                  super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar1)
    ;
  }
  std::vector<despot::TabularCPT,_std::allocator<despot::TabularCPT>_>::~vector
            (&this->initial_belief_funcs_);
  std::vector<despot::TerminalPattern,_std::allocator<despot::TerminalPattern>_>::~vector
            (&this->terminal_state_patterns_);
  std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::~vector
            (&this->terminal_reward_vars_);
  std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::~vector(&this->reward_vars_);
  std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::~vector(&this->action_vars_);
  std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::~vector(&this->obs_vars_);
  std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::~vector(&this->curr_state_vars_)
  ;
  std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::~vector(&this->prev_state_vars_)
  ;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
  ::~_Rb_tree(&(this->variables_)._M_t);
  pcVar2 = (this->file_name_)._M_dataplus._M_p;
  paVar3 = &(this->file_name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Parser::~Parser() {
}